

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespace.cpp
# Opt level: O0

void __thiscall
LiteScript::_Type_NAMESPACE::Load
          (_Type_NAMESPACE *this,istream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  Memory *this_00;
  byte bVar1;
  uint uVar2;
  uint id;
  Namespace *this_01;
  char *name;
  Variable *v;
  long *plVar3;
  long in_R8;
  bool bVar4;
  code *local_e0;
  Nullable<LiteScript::Variable> local_a8;
  uint local_78;
  char local_71;
  uint i;
  uchar c;
  string key;
  uint sz;
  Namespace *obj;
  offset_in_Memory_to_subr caller_local;
  Object *object_local;
  istream *stream_local;
  _Type_NAMESPACE *this_local;
  
  Object::Reassign(object,(Type *)_type_namespace,0x20);
  this_01 = Object::GetData<LiteScript::Namespace>(object);
  uVar2 = IStreamer::Read<unsigned_int>(stream);
  std::__cxx11::string::string((string *)&i);
  for (local_78 = 0; local_78 < uVar2; local_78 = local_78 + 1) {
    std::__cxx11::string::clear();
    while( true ) {
      bVar1 = std::ios::eof();
      bVar4 = false;
      if ((bVar1 & 1) == 0) {
        local_71 = std::istream::get();
        bVar4 = local_71 != '\0';
      }
      if (!bVar4) break;
      std::__cxx11::string::operator+=((string *)&i,local_71);
    }
    name = (char *)std::__cxx11::string::c_str();
    this_00 = object->memory;
    plVar3 = (long *)((long)(this_00->arr)._M_elems + in_R8);
    local_e0 = (code *)caller;
    if ((caller & 1) != 0) {
      local_e0 = *(code **)(*plVar3 + (caller - 1));
    }
    id = (*local_e0)(plVar3,stream);
    Memory::GetVariable(&local_a8,this_00,id);
    v = Nullable<LiteScript::Variable>::operator*(&local_a8);
    Namespace::DefineVariable(this_01,name,v);
    Nullable<LiteScript::Variable>::~Nullable(&local_a8);
  }
  std::__cxx11::string::~string((string *)&i);
  return;
}

Assistant:

void LiteScript::_Type_NAMESPACE::Load(std::istream &stream, Object &object, unsigned int (Memory::*caller)(std::istream&)) const {
    object.Reassign(Type::NAMESPACE, sizeof(Namespace));
    Namespace& obj = object.GetData<Namespace>();
    unsigned int sz = IStreamer::Read<unsigned int>(stream);
    std::string key;
    unsigned char c;
    for (unsigned int i = 0; i < sz; i++) {
        key.clear();
        while (!stream.eof() && (c = (unsigned char)stream.get()) != 0)
            key += c;
        obj.DefineVariable(key.c_str(), *object.memory.GetVariable((object.memory.*caller)(stream)));
    }
}